

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall duckdb::CheckpointTask::ExecuteTask(CheckpointTask *this)

{
  TableDataWriter *pTVar1;
  _Head_base<0UL,_duckdb::RowGroupWriter_*,_false> _Var2;
  pointer puVar3;
  reference pvVar4;
  type this_00;
  type pRVar5;
  reference pvVar6;
  type writer;
  reference pvVar7;
  pointer *__ptr;
  RowGroupWriteData local_68;
  vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_> local_38;
  
  pvVar4 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::operator[]
                     (((this->super_BaseCheckpointTask).checkpoint_state)->segments,this->index);
  this_00 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                      (&pvVar4->node);
  pTVar1 = ((this->super_BaseCheckpointTask).checkpoint_state)->writer;
  pRVar5 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                     (&pvVar4->node);
  (*pTVar1->_vptr_TableDataWriter[3])(&local_68,pTVar1,pRVar5);
  pvVar6 = vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
           ::operator[](&((this->super_BaseCheckpointTask).checkpoint_state)->writers,this->index);
  puVar3 = local_68.states.
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68.states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Var2._M_head_impl =
       (pvVar6->
       super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)._M_t.
       super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
       .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl;
  (pvVar6->super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>).
  _M_t.super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>.
  super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl = (RowGroupWriter *)puVar3;
  if (_Var2._M_head_impl != (RowGroupWriter *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_RowGroupWriter + 8))();
  }
  if (local_68.states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    (*(code *)(((local_68.states.
                 super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ColumnCheckpointState_*,_std::default_delete<duckdb::ColumnCheckpointState>_>
               .super__Head_base<0UL,_duckdb::ColumnCheckpointState_*,_false>._M_head_impl)->
              row_group)();
  }
  pvVar6 = vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
           ::operator[](&((this->super_BaseCheckpointTask).checkpoint_state)->writers,this->index);
  writer = unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>::
           operator*(pvVar6);
  RowGroup::WriteToDisk(&local_68,this_00,writer);
  pvVar7 = vector<duckdb::RowGroupWriteData,_true>::operator[]
                     (&((this->super_BaseCheckpointTask).checkpoint_state)->write_data,this->index);
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)(pvVar7->states).
                super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)(pvVar7->states).
                super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)(pvVar7->states).
                super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar7->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_68.states.
       super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pvVar7->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_68.states.
       super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pvVar7->states).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.states.
       super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.states.
  super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             *)&local_38);
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pvVar7->statistics).
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pvVar7->statistics).
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pvVar7->statistics).
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pvVar7->statistics).super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
  .super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.statistics.
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pvVar7->statistics).super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
  .super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.statistics.
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pvVar7->statistics).super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
  .super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.statistics.
       super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
       super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_68.statistics.super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.statistics.super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.statistics.super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
  super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector(&local_38)
  ;
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector
            (&local_68.statistics.
              super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             *)&local_68);
  return;
}

Assistant:

void ExecuteTask() override {
		auto &entry = checkpoint_state.segments[index];
		auto &row_group = *entry.node;
		checkpoint_state.writers[index] = checkpoint_state.writer.GetRowGroupWriter(*entry.node);
		checkpoint_state.write_data[index] = row_group.WriteToDisk(*checkpoint_state.writers[index]);
	}